

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::TextFormat::
     OutOfLinePrintString<std::basic_string_view<char,std::char_traits<char>>>
               (BaseTextGenerator *generator,
               basic_string_view<char,_std::char_traits<char>_> *values)

{
  AlphaNum *in_RDX;
  string local_60;
  size_t local_40;
  char *pcStack_38;
  
  local_40 = values->_M_len;
  pcStack_38 = values->_M_str;
  absl::lts_20240722::StrCat_abi_cxx11_(&local_60,(lts_20240722 *)&local_40,in_RDX);
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}